

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<int_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
               (string *s,char *fmt,int *v,bool *args,bool *args_1,bool *args_2,bool *args_3,
               bool *args_4,bool *args_5,bool *args_6,bool *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_10,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_11,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_12,
               optional<pbrt::Bounds2<float>_> *args_13,optional<pbrt::Bounds2<int>_> *args_14)

{
  long lVar1;
  ulong uVar2;
  int *in_RDX;
  bool *unaff_RBP;
  string *in_RDI;
  string *in_R9;
  bool *unaff_R13;
  bool *unaff_R14;
  bool *unaff_R15;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  optional<pbrt::Bounds2<float>_> *in_stack_00000028;
  optional<pbrt::Bounds2<int>_> *in_stack_00000030;
  bool *in_stack_00000048;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffcb0;
  char **in_stack_fffffffffffffcb8;
  char **in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  char *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  int line;
  char *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  LogLevel level;
  undefined4 in_stack_fffffffffffffd50;
  string local_2a8 [4];
  int in_stack_fffffffffffffd5c;
  string *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  string local_288 [32];
  undefined8 local_268;
  string local_260 [16];
  bool *in_stack_fffffffffffffdb0;
  bool *in_stack_fffffffffffffdb8;
  bool *in_stack_fffffffffffffdc0;
  bool *in_stack_fffffffffffffdc8;
  bool *in_stack_fffffffffffffdd0;
  bool *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  optional<pbrt::Bounds2<float>_> *in_stack_fffffffffffffe08;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffe10;
  string local_b8 [32];
  undefined4 local_98;
  undefined5 in_stack_ffffffffffffff78;
  bool *in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  bool *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  copyToFormatString(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x2a);
  bVar3 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x73);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,100);
  uVar5 = lVar1 != -1;
  if ((bVar3 & 1) == 0) {
    if ((bool)uVar5) {
      uVar2 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,100);
      IntegerFormatTrait<int>::fmt();
      std::__cxx11::string::replace((ulong)&stack0xffffffffffffff80,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffcc8,(int *)in_stack_fffffffffffffcc0);
      std::__cxx11::string::operator+=(in_RDI,local_b8);
      std::__cxx11::string::~string(local_b8);
    }
    else if ((bVar4 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(level,in_stack_fffffffffffffd38,line,in_stack_fffffffffffffd28);
      }
      std::__cxx11::string::c_str();
      formatOne<int_const&>(in_stack_fffffffffffffcc8,(int *)in_stack_fffffffffffffcc0);
      std::__cxx11::string::operator+=(in_RDI,local_2a8);
      std::__cxx11::string::~string(local_2a8);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffdc0);
      std::ostream::operator<<(&stack0xfffffffffffffdd0,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_268 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::__cxx11::string::operator+=(in_RDI,local_260);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffdc0);
    }
    stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
              (in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,
               (bool *)CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(uVar5,in_stack_ffffffffffffff78))),
               unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
               in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
               in_stack_00000030);
    local_98 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
               in_stack_fffffffffffffd5c,(bool *)CONCAT44(*in_RDX,in_stack_fffffffffffffd50),
               in_stack_00000048,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,
               in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,
               in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00,
               in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
    local_98 = 1;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}